

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O1

PerThreadSynch * absl::lts_20250127::Dequeue(PerThreadSynch *head,PerThreadSynch *pw)

{
  PerThreadSynch *pPVar1;
  PerThreadSynch *y;
  bool bVar2;
  
  pPVar1 = pw->next;
  y = pPVar1->next;
  pw->next = y;
  if (pPVar1 == head) {
    head = (PerThreadSynch *)0x0;
    if (pPVar1 != pw) {
      head = pw;
    }
  }
  else if (pw != head) {
    bVar2 = MuEquivalentWaiter(pw,y);
    if (bVar2) {
      if (y->skip == (PerThreadSynch *)0x0) {
        pw->skip = y;
      }
      else {
        pw->skip = y->skip;
      }
    }
  }
  return head;
}

Assistant:

static PerThreadSynch* Dequeue(PerThreadSynch* head, PerThreadSynch* pw) {
  PerThreadSynch* w = pw->next;
  pw->next = w->next;                 // snip w out of list
  if (head == w) {                    // we removed the head
    head = (pw == w) ? nullptr : pw;  // either emptied list, or pw is new head
  } else if (pw != head && MuEquivalentWaiter(pw, pw->next)) {
    // pw can skip to its new successor
    if (pw->next->skip !=
        nullptr) {  // either skip to its successors skip target
      pw->skip = pw->next->skip;
    } else {  // or to pw's successor
      pw->skip = pw->next;
    }
  }
  return head;
}